

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O2

int coda_expression_eval_integer(coda_expression *expr,coda_cursor_conflict *cursor,int64_t *value)

{
  int iVar1;
  int iVar2;
  char *message;
  eval_info info;
  
  if (expr->result_type == coda_expression_integer) {
    if (cursor == (coda_cursor_conflict *)0x0) {
      if (expr->is_constant == 0) {
        message = "cursor argument may not be NULL if expression is not constant";
        goto LAB_001128e5;
      }
      info.orig_cursor = (coda_cursor_conflict *)0x0;
    }
    else {
      info.orig_cursor = cursor;
      memcpy(&info.cursor,cursor,0x310);
    }
    info.index[2] = 0;
    info.variable_index = 0;
    info.index[0] = 0;
    info.index[1] = 0;
    info.variable_name = (char *)0x0;
    iVar1 = eval_integer(&info,expr,value);
    if (iVar1 != 0 && cursor != (coda_cursor_conflict *)0x0) {
      iVar2 = coda_cursor_compare(cursor,&info.cursor);
      iVar1 = -1;
      if (iVar2 != 0) {
        coda_cursor_add_to_error_message(&info.cursor);
      }
    }
    else {
      iVar1 = -(uint)(iVar1 != 0);
    }
  }
  else {
    message = "expression is not an \'integer\' expression";
LAB_001128e5:
    coda_set_error(-100,message);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

LIBCODA_API int coda_expression_eval_integer(const coda_expression *expr, const coda_cursor *cursor, int64_t *value)
{
    eval_info info;

    if (expr->result_type != coda_expression_integer)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not an 'integer' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_integer(&info, expr, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    return 0;
}